

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  istream *piVar8;
  size_type sVar9;
  ERFilter *pEVar10;
  reference pvVar11;
  OCRTesseract *pOVar12;
  ulong uVar13;
  reference pvVar14;
  reference pvVar15;
  long lVar16;
  reference pvVar17;
  char *pcVar18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  A;
  size_t sVar19;
  ulong uVar20;
  reference this;
  ostream *poVar21;
  int *piVar22;
  undefined8 *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  float fVar23;
  int dist;
  int l;
  int best_dist;
  int best_match;
  int j_2;
  float max_edit_distance_ratio;
  float IoU;
  Rect intersection;
  int j_1;
  int to_delete;
  int i_1;
  float thr;
  int j;
  vector<float,_std::allocator<float>_> confidences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boxes;
  Mat group_img;
  int i;
  string output;
  Ptr<cv::text::OCRTesseract> ocr;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> nm_boxes;
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  nm_region_groups;
  vector<float,_std::allocator<float>_> final_confs;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> final_boxes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  final_words;
  int c;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  regions;
  Ptr<cv::text::ERFilter> er_filter2;
  Ptr<cv::text::ERFilter> er_filter1;
  Mat grey;
  vector<cv::Mat,_std::allocator<cv::Mat>_> channels;
  string lex_word;
  ifstream infile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lex;
  Mat image;
  value_type *in_stack_fffffffffffff078;
  Rect_<int> *this_00;
  _InputArray *in_stack_fffffffffffff080;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff088;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff090;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff098;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  *in_stack_fffffffffffff0a0;
  MatExpr *in_stack_fffffffffffff0a8;
  allocator<char> *in_stack_fffffffffffff0b0;
  char *in_stack_fffffffffffff0b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff0c0;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *in_stack_fffffffffffff0c8;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *in_stack_fffffffffffff0d0;
  float local_eb4;
  string *B;
  int local_e10;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff258;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *in_stack_fffffffffffff260;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff268;
  undefined4 in_stack_fffffffffffff270;
  int in_stack_fffffffffffff274;
  int local_cb0 [2];
  int local_ca8;
  int local_ca4;
  int local_c9c [2];
  int local_c94;
  int local_c90;
  int local_c8c [3];
  int local_c80;
  int local_c7c;
  int local_c78 [3];
  int local_c6c;
  int local_c68;
  int local_c60;
  int local_c5c;
  int local_c58;
  int local_c54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c38;
  char *local_c30;
  undefined8 local_c28;
  undefined8 local_c20;
  undefined8 local_c18;
  int local_c10;
  float local_c0c;
  float *local_c08;
  float *local_c00;
  float *local_bf8;
  Rect_<int> *local_be8;
  Rect_<int> *local_be0;
  Rect_<int> *local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bb8;
  float *local_ba8;
  float *local_ba0;
  float *local_b98;
  Rect_<int> *local_b88;
  Rect_<int> *local_b80;
  Rect_<int> *local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b58;
  float local_b44;
  Rect_<int> local_b40;
  int local_b30;
  int local_b2c;
  int local_b28;
  float local_b24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b08;
  char *local_b00;
  undefined8 local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  int local_adc;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined1 local_ab9;
  undefined8 local_ab8;
  undefined8 local_ab0;
  char *local_aa8;
  undefined8 local_aa0;
  vector<float,_std::allocator<float>_> local_a98;
  vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> local_a80;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_a68;
  _InputArray local_a50;
  _OutputArray local_a30;
  _InputArray local_a18 [2];
  _OutputArray local_9e8 [5];
  undefined1 local_970 [352];
  Mat local_810 [100];
  int local_7ac;
  string local_7a8 [32];
  char local_788 [16];
  Rect_<int> local_778 [2];
  _InputArray local_758;
  _InputArray local_740;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_728;
  vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
  local_710;
  vector<float,_std::allocator<float>_> local_6f8;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_6e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c8;
  _InputArray local_6b0;
  _InputArray local_698;
  int local_680;
  vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
  local_678;
  allocator<char> local_659;
  string local_658 [32];
  string local_638 [16];
  Ptr local_628 [23];
  allocator<char> local_611;
  string local_610 [32];
  string local_5f0 [16];
  Ptr local_5e0 [16];
  Mat local_5d0 [32];
  Scalar_ local_5b0 [352];
  Mat local_450 [96];
  _InputArray local_3f0;
  _InputArray local_3d8;
  Mat local_3c0 [96];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_360;
  string local_348 [32];
  istream local_328 [520];
  string local_120;
  allocator<char> local_f1;
  string local_f0 [32];
  string local_d0 [96];
  Mat local_70 [8];
  int local_68;
  int local_64;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  cv::Mat::Mat(local_70);
  if (local_8 < 2) {
    poVar21 = std::operator<<((ostream *)&std::cout,"    Usage: ");
    poVar21 = std::operator<<(poVar21,(char *)*local_10);
    poVar21 = std::operator<<(poVar21," <input_image> [<input_txt_lexicon>]");
    std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_120.field_2._8_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    cv::imread(local_d0,(int)local_f0);
    cv::Mat::operator=(local_70,(Mat *)local_d0);
    cv::Mat::~Mat((Mat *)local_d0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1117d3);
    iVar4 = (int)in_R8;
    if (2 < local_8) {
      std::ifstream::ifstream(local_328,local_10[2],8);
      std::__cxx11::string::string(local_348);
      while( true ) {
        piVar8 = std::operator>>(local_328,local_348);
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        iVar4 = (int)in_R8;
        if (!bVar3) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff090._M_current,
                    (value_type *)in_stack_fffffffffffff088._M_current);
      }
      std::__cxx11::string::~string(local_348);
      std::ifstream::~ifstream(local_328);
    }
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x1118e6);
    cv::Mat::Mat(local_3c0);
    cv::_InputArray::_InputArray(in_stack_fffffffffffff080,in_stack_fffffffffffff078);
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)in_stack_fffffffffffff080,in_stack_fffffffffffff078);
    cv::cvtColor((cv *)&local_3d8,&local_3f0,(_OutputArray *)0x7,0,iVar4);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x11194c);
    cv::_InputArray::~_InputArray(&local_3d8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffff090._M_current,
               (value_type *)in_stack_fffffffffffff088._M_current);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)in_stack_fffffffffffff080,(double)in_stack_fffffffffffff078);
    cv::operator-(local_5b0,local_5d0);
    cv::MatExpr::operator_cast_to_Mat(in_stack_fffffffffffff0a8);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffff080,
               in_stack_fffffffffffff078);
    cv::Mat::~Mat(local_450);
    cv::MatExpr::~MatExpr((MatExpr *)in_stack_fffffffffffff080);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    cv::text::loadClassifierNM1(local_5f0);
    cv::text::createERFilterNM1(local_5e0,(int)local_5f0,0.00015,0.13,0.2,true,0.1);
    cv::Ptr<cv::text::ERFilter::Callback>::~Ptr((Ptr<cv::text::ERFilter::Callback> *)0x111a86);
    std::__cxx11::string::~string(local_610);
    std::allocator<char>::~allocator(&local_611);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff0c0,in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0);
    cv::text::loadClassifierNM2(local_638);
    cv::text::createERFilterNM2(local_628,0.5);
    cv::Ptr<cv::text::ERFilter::Callback>::~Ptr((Ptr<cv::text::ERFilter::Callback> *)0x111b16);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator(&local_659);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_360);
    std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>::allocator
              ((allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_> *)
               0x111b5a);
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::vector(in_stack_fffffffffffff0a0,(size_type)in_stack_fffffffffffff098._M_current,
             (allocator_type *)in_stack_fffffffffffff090._M_current);
    std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>::~allocator
              ((allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_> *)
               0x111b86);
    for (local_680 = 0; iVar4 = local_680,
        sVar9 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_360), iVar4 < (int)sVar9
        ; local_680 = local_680 + 1) {
      pEVar10 = cv::Ptr<cv::text::ERFilter>::operator->((Ptr<cv::text::ERFilter> *)0x111bcb);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](&local_360,(long)local_680);
      cv::_InputArray::_InputArray(in_stack_fffffffffffff080,in_stack_fffffffffffff078);
      pvVar11 = std::
                vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                ::operator[](&local_678,(long)local_680);
      (**(code **)(*(long *)pEVar10 + 0x40))(pEVar10,&local_698,pvVar11);
      cv::_InputArray::~_InputArray(&local_698);
      pEVar10 = cv::Ptr<cv::text::ERFilter>::operator->((Ptr<cv::text::ERFilter> *)0x111c47);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](&local_360,(long)local_680);
      cv::_InputArray::_InputArray(in_stack_fffffffffffff080,in_stack_fffffffffffff078);
      pvVar11 = std::
                vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                ::operator[](&local_678,(long)local_680);
      (**(code **)(*(long *)pEVar10 + 0x40))(pEVar10,&local_6b0,pvVar11);
      cv::_InputArray::~_InputArray(&local_6b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x111ee7);
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)0x111ef4);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x111f01);
    std::
    vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ::vector((vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
              *)0x111f0e);
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)0x111f1b);
    cv::_InputArray::_InputArray(in_stack_fffffffffffff080,in_stack_fffffffffffff078);
    cv::_InputArray::_InputArray
              (in_stack_fffffffffffff080,
               (vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffff078);
    this_00 = local_778;
    std::__cxx11::string::string((string *)this_00);
    cv::text::erGrouping
              (&local_740,&local_758,(vector *)&local_678,(vector *)&local_710,(vector *)&local_728,
               0,(string *)this_00,0.5);
    std::__cxx11::string::~string((string *)local_778);
    cv::_InputArray::~_InputArray(&local_758);
    cv::_InputArray::~_InputArray(&local_740);
    cv::text::OCRTesseract::create(local_788,(char *)0x0,(char *)0x0,0,3);
    std::__cxx11::string::string(local_7a8);
    for (local_7ac = 0; iVar4 = local_7ac,
        sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size(&local_728),
        iVar4 < (int)sVar9; local_7ac = local_7ac + 1) {
      cv::Mat::zeros((int)local_970,local_68 + 2,local_64 + 2);
      cv::MatExpr::operator_cast_to_Mat(in_stack_fffffffffffff0a8);
      cv::MatExpr::~MatExpr((MatExpr *)in_stack_fffffffffffff080);
      std::
      vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
      ::operator[](&local_710,(long)local_7ac);
      std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::vector
                (in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8);
      er_draw((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
              CONCAT44(in_stack_fffffffffffff274,in_stack_fffffffffffff270),
              (vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
               *)in_stack_fffffffffffff268._M_current,in_stack_fffffffffffff260,
              (Mat *)in_stack_fffffffffffff258._M_current);
      std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>::~vector
                ((vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *)
                 in_stack_fffffffffffff090._M_current);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                (&local_728,(long)local_7ac);
      cv::Mat::operator()((Mat *)in_stack_fffffffffffff088._M_current,
                          (Rect *)in_stack_fffffffffffff080);
      cv::_OutputArray::_OutputArray((_OutputArray *)in_stack_fffffffffffff080,(Mat *)this_00);
      cv::Mat::copyTo(local_9e8);
      cv::_OutputArray::~_OutputArray((_OutputArray *)0x112142);
      cv::Mat::~Mat((Mat *)local_9e8);
      cv::_InputArray::_InputArray(in_stack_fffffffffffff080,(Mat *)this_00);
      cv::_OutputArray::_OutputArray((_OutputArray *)in_stack_fffffffffffff080,(Mat *)this_00);
      cv::Scalar_<double>::Scalar_((Scalar_<double> *)in_stack_fffffffffffff080,(double)this_00);
      in_stack_fffffffffffff080 = &local_a50;
      uVar13 = (ulong)this_00 & 0xffffffff00000000;
      cv::copyMakeBorder(local_a18,&local_a30,0xf,0xf,0xf,0xf,0,(Scalar_ *)in_stack_fffffffffffff080
                        );
      cv::_OutputArray::~_OutputArray((_OutputArray *)0x1121d7);
      cv::_InputArray::~_InputArray(local_a18);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)0x1121f9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x11220e);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x112223);
      pOVar12 = cv::Ptr<cv::text::OCRTesseract>::operator->((Ptr<cv::text::OCRTesseract> *)0x112230)
      ;
      this_00 = (Rect_<int> *)(uVar13 & 0xffffffff00000000);
      (**(code **)(*(long *)pOVar12 + 0x10))
                (pOVar12,local_810,local_7a8,&local_a68,&local_a80,&local_a98);
      local_ab0 = std::__cxx11::string::begin();
      local_ab8 = std::__cxx11::string::end();
      local_ab9 = 10;
      local_aa8 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )in_stack_fffffffffffff098._M_current,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )in_stack_fffffffffffff090._M_current,
                                     in_stack_fffffffffffff088._M_current);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff080,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00);
      local_ad0 = std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff080,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00);
      local_ad8 = std::__cxx11::string::erase(local_7a8,local_aa0,local_ac8);
      uVar13 = std::__cxx11::string::size();
      if (uVar13 < 3) {
        local_120.field_2._8_4_ = 9;
      }
      else {
        for (local_adc = 0; iVar4 = local_adc,
            sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size(&local_a68),
            iVar4 < (int)sVar9; local_adc = local_adc + 1) {
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_728,(long)local_7ac);
          iVar4 = pvVar14->x;
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_a68,(long)local_adc);
          pvVar14->x = iVar4 + -0xf + pvVar14->x;
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_728,(long)local_7ac);
          iVar4 = pvVar14->y;
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_a68,(long)local_adc);
          pvVar14->y = iVar4 + -0xf + pvVar14->y;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_a80,(long)local_adc);
          uVar13 = std::__cxx11::string::size();
          if ((1 < uVar13) &&
             (pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                  (&local_a98,(long)local_adc), 51.0 < *pvVar15 || *pvVar15 == 51.0)
             ) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_a80,(long)local_adc);
            lVar16 = std::__cxx11::string::size();
            if (lVar16 == 2) {
              pvVar17 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_a80,(long)local_adc);
              pcVar18 = (char *)std::__cxx11::string::operator[]((ulong)pvVar17);
              in_stack_fffffffffffff274 = (int)*pcVar18;
              pvVar17 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_a80,(long)local_adc);
              pcVar18 = (char *)std::__cxx11::string::operator[]((ulong)pvVar17);
              if (in_stack_fffffffffffff274 == *pcVar18) goto LAB_0011297c;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_a80,(long)local_adc);
            uVar13 = std::__cxx11::string::size();
            if ((3 < uVar13) ||
               (pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                    (&local_a98,(long)local_adc),
               60.0 < *pvVar15 || *pvVar15 == 60.0)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_a80,(long)local_adc);
              bVar3 = isRepetitive((string *)in_stack_fffffffffffff088._M_current);
              in_stack_fffffffffffff270 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff270);
              if (!bVar3) {
                sVar9 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_120);
                if (sVar9 != 0) {
                  in_stack_fffffffffffff260 = &local_a80;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff260,(long)local_adc);
                  local_ae8 = std::__cxx11::string::begin();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff260,(long)local_adc);
                  local_af0 = std::__cxx11::string::end();
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)in_stack_fffffffffffff260,(long)local_adc);
                  local_af8 = std::__cxx11::string::begin();
                  in_stack_fffffffffffff268 =
                       std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                 ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )in_stack_fffffffffffff098._M_current,
                                  (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )in_stack_fffffffffffff090._M_current,in_stack_fffffffffffff088,
                                  (_func_int_int *)in_stack_fffffffffffff080);
                  local_b00 = in_stack_fffffffffffff268._M_current;
                  local_b10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)this_00);
                  local_b18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)this_00);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_a80,(long)local_adc);
                  in_stack_fffffffffffff258 =
                       std::
                       find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                 (in_stack_fffffffffffff098,in_stack_fffffffffffff090,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff088._M_current);
                  local_b08 = in_stack_fffffffffffff258._M_current;
                  local_b20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)this_00);
                  bVar3 = __gnu_cxx::operator==
                                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_stack_fffffffffffff080,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)this_00);
                  if (bVar3) {
                    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                        (&local_a98,(long)local_adc);
                    *pvVar15 = 200.0;
                  }
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_a80,(long)local_adc);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff090._M_current,
                            (value_type *)in_stack_fffffffffffff088._M_current);
                std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                          (&local_a68,(long)local_adc);
                std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::push_back
                          ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                           in_stack_fffffffffffff090._M_current,
                           (value_type *)in_stack_fffffffffffff088._M_current);
                std::vector<float,_std::allocator<float>_>::operator[](&local_a98,(long)local_adc);
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)
                           in_stack_fffffffffffff090._M_current,
                           (value_type_conflict2 *)in_stack_fffffffffffff088._M_current);
              }
            }
          }
LAB_0011297c:
        }
        local_120.field_2._8_4_ = 0;
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff090._M_current);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff090._M_current);
      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                 in_stack_fffffffffffff090._M_current);
      cv::Mat::~Mat(local_810);
    }
    local_b24 = 0.5;
    local_b28 = 0;
    while (uVar13 = (ulong)local_b28,
          sVar9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_6c8), uVar13 < sVar9) {
      local_b2c = -1;
      local_b30 = local_b28 + 1;
      while (uVar13 = (ulong)local_b30,
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_6c8), uVar13 < sVar9) {
        local_b2c = -1;
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_b28);
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_b30);
        cv::operator&((Rect_<int> *)in_stack_fffffffffffff098._M_current,
                      (Rect_<int> *)in_stack_fffffffffffff090._M_current);
        iVar4 = cv::Rect_<int>::area(&local_b40);
        pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                            (&local_6e0,(long)local_b28);
        iVar5 = cv::Rect_<int>::area(pvVar14);
        pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                            (&local_6e0,(long)local_b30);
        iVar6 = cv::Rect_<int>::area(pvVar14);
        iVar7 = cv::Rect_<int>::area(&local_b40);
        local_b44 = (float)iVar4 / (float)((iVar5 + iVar6) - iVar7);
        if (local_b44 <= local_b24) {
          iVar4 = cv::Rect_<int>::area(&local_b40);
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_6e0,(long)local_b28);
          iVar5 = cv::Rect_<int>::area(pvVar14);
          if ((double)iVar5 * 0.8 < (double)iVar4) goto LAB_00112cd7;
          iVar4 = cv::Rect_<int>::area(&local_b40);
          pvVar14 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                              (&local_6e0,(long)local_b30);
          iVar5 = cv::Rect_<int>::area(pvVar14);
          if ((double)iVar5 * 0.8 < (double)iVar4) goto LAB_00112cd7;
          local_b30 = local_b30 + 1;
        }
        else {
LAB_00112cd7:
          pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_6f8,(long)local_b28);
          fVar23 = *pvVar15;
          pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&local_6f8,(long)local_b30);
          if (*pvVar15 <= fVar23) {
            local_e10 = local_b30;
          }
          else {
            local_e10 = local_b28;
          }
          local_b2c = local_e10;
          if (local_e10 != local_b30) break;
          local_b60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this_00);
          local_b58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff088._M_current,
                                  (difference_type)in_stack_fffffffffffff080);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_stack_fffffffffffff080,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00);
          local_b68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::erase(in_stack_fffffffffffff090._M_current,
                              in_stack_fffffffffffff098._M_current);
          local_b80 = (Rect_<int> *)
                      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::begin
                                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this_00
                                );
          local_b78 = (Rect_<int> *)
                      __gnu_cxx::
                      __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                      ::operator+((__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                                   *)in_stack_fffffffffffff088._M_current,
                                  (difference_type)in_stack_fffffffffffff080);
          __gnu_cxx::
          __normal_iterator<cv::Rect_<int>const*,std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>
          ::__normal_iterator<cv::Rect_<int>*>
                    ((__normal_iterator<const_cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                      *)in_stack_fffffffffffff080,
                     (__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                      *)this_00);
          local_b88 = (Rect_<int> *)
                      std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::erase
                                ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                                 in_stack_fffffffffffff090._M_current,
                                 (const_iterator)in_stack_fffffffffffff098._M_current);
          local_ba0 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                         ((vector<float,_std::allocator<float>_> *)this_00);
          local_b98 = (float *)__gnu_cxx::
                               __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               ::operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                            *)in_stack_fffffffffffff088._M_current,
                                           (difference_type)in_stack_fffffffffffff080);
          __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
          __normal_iterator<float*>
                    ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
                      *)in_stack_fffffffffffff080,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                     this_00);
          local_ba8 = (float *)std::vector<float,_std::allocator<float>_>::erase
                                         ((vector<float,_std::allocator<float>_> *)
                                          in_stack_fffffffffffff090._M_current,
                                          (const_iterator)in_stack_fffffffffffff098._M_current);
        }
      }
      if (local_b2c == local_b28) {
        local_bc0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00);
        local_bb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff088._M_current,
                                (difference_type)in_stack_fffffffffffff080);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff080,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this_00);
        local_bc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::erase(in_stack_fffffffffffff090._M_current,
                            in_stack_fffffffffffff098._M_current);
        local_be0 = (Rect_<int> *)
                    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::begin
                              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)this_00);
        local_bd8 = (Rect_<int> *)
                    __gnu_cxx::
                    __normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                    ::operator+((__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                                 *)in_stack_fffffffffffff088._M_current,
                                (difference_type)in_stack_fffffffffffff080);
        __gnu_cxx::
        __normal_iterator<cv::Rect_<int>const*,std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>
        ::__normal_iterator<cv::Rect_<int>*>
                  ((__normal_iterator<const_cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                    *)in_stack_fffffffffffff080,
                   (__normal_iterator<cv::Rect_<int>_*,_std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_>
                    *)this_00);
        local_be8 = (Rect_<int> *)
                    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::erase
                              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
                               in_stack_fffffffffffff090._M_current,
                               (const_iterator)in_stack_fffffffffffff098._M_current);
        local_c00 = (float *)std::vector<float,_std::allocator<float>_>::begin
                                       ((vector<float,_std::allocator<float>_> *)this_00);
        local_bf8 = (float *)__gnu_cxx::
                             __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                             ::operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                          *)in_stack_fffffffffffff088._M_current,
                                         (difference_type)in_stack_fffffffffffff080);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   in_stack_fffffffffffff080,
                   (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                   this_00);
        local_c08 = (float *)std::vector<float,_std::allocator<float>_>::erase
                                       ((vector<float,_std::allocator<float>_> *)
                                        in_stack_fffffffffffff090._M_current,
                                        (const_iterator)in_stack_fffffffffffff098._M_current);
      }
      else {
        local_b28 = local_b28 + 1;
      }
    }
    local_c0c = 0.34;
    for (local_c10 = 0; uVar13 = (ulong)local_c10,
        sVar9 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size(&local_6e0),
        uVar13 < sVar9; local_c10 = local_c10 + 1) {
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_120);
      if (sVar9 == 0) {
LAB_00113457:
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::tl(this_00);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_c68);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::tl(this_00);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_c6c);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::br(this_00);
        local_c7c = local_64 + -2;
        piVar22 = std::min<int>(local_c78,&local_c7c);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,*piVar22);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::tl(this_00);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_c80);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::br(this_00);
        local_c90 = local_64 + -2;
        piVar22 = std::min<int>(local_c8c,&local_c90);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,*piVar22);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::br(this_00);
        local_c9c[0] = local_68 + -2;
        piVar22 = std::min<int>(&local_c94,local_c9c);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,*piVar22);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::tl(this_00);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,local_ca4);
        poVar21 = std::operator<<(poVar21,",");
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                  (&local_6e0,(long)local_c10);
        cv::Rect_<int>::br(this_00);
        local_cb0[0] = local_68 + -2;
        piVar22 = std::min<int>(&local_ca8,local_cb0);
        poVar21 = (ostream *)std::ostream::operator<<(poVar21,*piVar22);
        in_stack_fffffffffffff098._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(poVar21,",");
        pvVar17 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_6c8,(long)local_c10);
        in_stack_fffffffffffff090._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(in_stack_fffffffffffff098._M_current,(string *)pvVar17);
        std::ostream::operator<<
                  ((ostream *)in_stack_fffffffffffff090._M_current,
                   std::endl<char,std::char_traits<char>>);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        local_c18 = std::__cxx11::string::begin();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        local_c20 = std::__cxx11::string::end();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        local_c28 = std::__cxx11::string::begin();
        local_c30 = (char *)std::
                            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffff098._M_current,
                                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )in_stack_fffffffffffff090._M_current,
                                       in_stack_fffffffffffff088,
                                       (_func_int_int *)in_stack_fffffffffffff080);
        B = &local_120;
        local_c40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this_00);
        local_c48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        A = std::
            find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                      (in_stack_fffffffffffff098,in_stack_fffffffffffff090,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff088._M_current);
        local_c38 = A._M_current;
        local_c50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00);
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff080,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)this_00);
        if (!bVar3) goto LAB_00113457;
        local_c54 = -1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        local_c58 = std::__cxx11::string::size();
        for (local_c5c = 0; uVar13 = (ulong)local_c5c,
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_120), uVar13 < sVar9; local_c5c = local_c5c + 1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_120,(long)local_c5c);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_6c8,(long)local_c10);
          sVar19 = edit_distance(A._M_current,B);
          local_c60 = (int)sVar19;
          if (local_c60 < local_c58) {
            local_c54 = local_c5c;
            local_c58 = local_c60;
          }
        }
        uVar13 = (ulong)local_c58;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_6c8,(long)local_c10);
        uVar20 = std::__cxx11::string::size();
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar20;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar13;
        uVar13 = SUB168(auVar2 / auVar1,0);
        fVar23 = (float)((ulong)(SUB164(auVar2 / auVar1,0) & 1) | uVar13 >> 1);
        local_eb4 = fVar23 + fVar23;
        if (-1 < (long)uVar13) {
          local_eb4 = (float)(long)uVar13;
        }
        if (local_eb4 < local_c0c) {
          pvVar17 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_120,(long)local_c54);
          this = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_6c8,(long)local_c10);
          std::__cxx11::string::operator=((string *)this,(string *)pvVar17);
          goto LAB_00113457;
        }
      }
    }
    local_4 = 0;
    local_120.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_7a8);
    cv::Ptr<cv::text::OCRTesseract>::~Ptr((Ptr<cv::text::OCRTesseract> *)0x113879);
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
               in_stack_fffffffffffff090._M_current);
    std::
    vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
    ::~vector((vector<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>,_std::allocator<std::vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>_>_>
               *)in_stack_fffffffffffff090._M_current);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff090._M_current);
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
               in_stack_fffffffffffff090._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff090._M_current);
    std::
    vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
    ::~vector((vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
               *)in_stack_fffffffffffff090._M_current);
    cv::Ptr<cv::text::ERFilter>::~Ptr((Ptr<cv::text::ERFilter> *)0x1138d4);
    cv::Ptr<cv::text::ERFilter>::~Ptr((Ptr<cv::text::ERFilter> *)0x1138e1);
    cv::Mat::~Mat(local_3c0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffff090._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff090._M_current);
  }
  cv::Mat::~Mat(local_70);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{

    Mat image;
    if(argc>1)
    {
        image  = imread(argv[1]);
    }
    else
    {
        cout << "    Usage: " << argv[0] << " <input_image> [<input_txt_lexicon>]" << endl;
        return(0);
    }

    // Load lexicon if provided
    vector<string> lex;
    if(argc>2)
    {
        ifstream infile(argv[2]);
        string lex_word;
        while (infile >> lex_word)
        {
            lex.push_back(lex_word);
        }
    }

    /*Text Detection*/

    // Extract channels to be processed individually
    vector<Mat> channels;

    Mat grey;
    cvtColor(image,grey,COLOR_RGB2GRAY);


    // Extract channels to be processed individually
    // computeNMChannels(image, channels);
    // Notice here we are only using grey channel.
    channels.push_back(grey);
    channels.push_back(255-grey);

    // Create ERFilter objects with the 1st and 2nd stage default classifiers
    Ptr<ERFilter> er_filter1 = createERFilterNM1(loadClassifierNM1("trained_classifierNM1.xml"),8,0.00015f,0.13f,0.2f,true,0.1f);
    Ptr<ERFilter> er_filter2 = createERFilterNM2(loadClassifierNM2("trained_classifierNM2.xml"),0.5);

    vector<vector<ERStat> > regions(channels.size());
    // Apply the default cascade classifier to each independent channel
    for (int c=0; c<(int)channels.size(); c++)
    {
        er_filter1->run(channels[c], regions[c]);
        er_filter2->run(channels[c], regions[c]);
    }

    vector<string> final_words;
    vector<Rect>   final_boxes;
    vector<float>  final_confs;


    // Detect character groups
    vector< vector<Vec2i> > nm_region_groups;
    vector<Rect> nm_boxes;
    erGrouping(image, channels, regions, nm_region_groups, nm_boxes,ERGROUPING_ORIENTATION_HORIZ);



    /*Text Recognition (OCR)*/

    Ptr<OCRTesseract> ocr = OCRTesseract::create();
    string output;


    for (int i=0; i<(int)nm_boxes.size(); i++)
    {

        Mat group_img = Mat::zeros(image.rows+2, image.cols+2, CV_8UC1);
        er_draw(channels, regions, nm_region_groups[i], group_img);
        group_img(nm_boxes[i]).copyTo(group_img);
        copyMakeBorder(group_img,group_img,15,15,15,15,BORDER_CONSTANT,Scalar(0));

        vector<Rect>   boxes;
        vector<string> words;
        vector<float>  confidences;
        ocr->run(group_img, output, &boxes, &words, &confidences, OCR_LEVEL_WORD);

        output.erase(remove(output.begin(), output.end(), '\n'), output.end());
        //cout << "OCR output = \"" << output << "\" lenght = " << output.size() << endl;
        if (output.size() < 3)
            continue;

        for (int j=0; j<(int)boxes.size(); j++)
        {
            boxes[j].x += nm_boxes[i].x-15;
            boxes[j].y += nm_boxes[i].y-15;

            /* Filter words with low confidence, or less than 3 chars, or noisy recognitions */
            // Threshold values have been set using the ICDAR train set.
            //cout << "  word = " << words[j] << "\t confidence = " << confidences[j] << endl;
            if ((words[j].size() < 2) || (confidences[j] < 51) ||
                    ((words[j].size()==2) && (words[j][0] == words[j][1])) ||
                    ((words[j].size()< 4) && (confidences[j] < 60)) ||
                    isRepetitive(words[j]))
                continue;

            /* Increase confidence of predicted words matching a word in the lexicon */
            if (lex.size() > 0)
            {
                std::transform(words[j].begin(), words[j].end(), words[j].begin(), ::toupper);
                if (find(lex.begin(), lex.end(), words[j]) == lex.end())
                    confidences[j] = 200;
            }

            final_words.push_back(words[j]);
            final_boxes.push_back(boxes[j]);
            final_confs.push_back(confidences[j]);
        }

    }


    /* Non Maximal Suppression using OCR confidence */
    float thr = 0.5;

    for (int i=0; i<final_words.size(); )
    {
        int to_delete = -1;
        for (int j=i+1; j<final_words.size(); )
        {
            to_delete = -1;
            Rect intersection = final_boxes[i] & final_boxes[j];
            float IoU = (float)intersection.area() / (final_boxes[i].area() + final_boxes[j].area() - intersection.area());
            if ((IoU > thr) || (intersection.area() > 0.8*final_boxes[i].area()) || (intersection.area() > 0.8*final_boxes[j].area()))
            {
                // if regions overlap more than thr delete the one with lower confidence
                to_delete = (final_confs[i] < final_confs[j]) ? i : j;

                if (to_delete == j )
                {
                    final_words.erase(final_words.begin()+j);
                    final_boxes.erase(final_boxes.begin()+j);
                    final_confs.erase(final_confs.begin()+j);
                    continue;
                } else {
                    break;
                }
            }
            j++;
        }
        if (to_delete == i )
        {
            final_words.erase(final_words.begin()+i);
            final_boxes.erase(final_boxes.begin()+i);
            final_confs.erase(final_confs.begin()+i);
            continue;
        }
        i++;
    }

    /* Predicted words which are not in the lexicon are filtered
       or changed to match one (when edit distance ratio < 0.34)*/
    float max_edit_distance_ratio = 0.34;
    for (int j=0; j<final_boxes.size(); j++)
    {

        if (lex.size() > 0)
        {
            std::transform(final_words[j].begin(), final_words[j].end(), final_words[j].begin(), ::toupper);
            if (find(lex.begin(), lex.end(), final_words[j]) == lex.end())
            {
                int best_match = -1;
                int best_dist  = final_words[j].size();
                for (int l=0; l<lex.size(); l++)
                {
                    int dist = edit_distance(lex[l],final_words[j]);
                    if (dist < best_dist)
                    {
                        best_match = l;
                        best_dist = dist;
                    }
                }
                if (best_dist/final_words[j].size() < max_edit_distance_ratio)
                    final_words[j] = lex[best_match];
                else
                    continue;
            }
        }

        // Output final recognition in csv format compatible with the ICDAR Robust Reading Competition
        cout << final_boxes[j].tl().x << ","
             << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2)
             << "," << final_boxes[j].tl().y << ","
             << min(final_boxes[j].br().x,image.cols-2) << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_boxes[j].tl().x << ","
             << min(final_boxes[j].br().y,image.rows-2) << ","
             << final_words[j] << endl ;
    }

    return 0;
}